

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZBSpStructMatrix.cpp
# Opt level: O2

TPZMatrix<std::complex<double>_> * __thiscall
TPZBSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>::Create
          (TPZBSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_> *this
          )

{
  TPZEquationFilter *this_00;
  undefined8 *puVar1;
  uint uVar2;
  TPZCompMesh *this_01;
  TNode *pTVar3;
  long lVar4;
  TPZFYsmpMatrix<std::complex<double>_> *this_02;
  int64_t iVar5;
  void *pvVar6;
  ulong uVar7;
  void *pvVar8;
  void *__s;
  int64_t iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  TPZVec<long> elgraphindex;
  TPZRenumbering metis;
  TPZManVector<long,_10> nodegraphindex;
  TPZManVector<long,_10> nodegraph;
  TPZStack<long,_10> elgraph;
  
  lVar4 = (**(code **)(*(long *)(this->
                                super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                                ).super_TPZStructMatrixT<std::complex<double>_>.
                                super_TPZStructMatrix.fMesh + 0x98))();
  if (lVar4 != 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZSpStructMatrix should not be called with CreateAssemble for a substructure mesh\n"
                   );
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZBSpStructMatrix.cpp"
               ,0x1a);
  }
  iVar5 = (&(this->
            super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
            ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fEquationFilter.
            fNumEq)[(ulong)(this->
                           super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                           ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.
                           fEquationFilter.fIsActive * 4];
  this_02 = (TPZFYsmpMatrix<std::complex<double>_> *)operator_new(0x3e0);
  TPZFYsmpMatrix<std::complex<double>_>::TPZFYsmpMatrix(this_02,iVar5,iVar5);
  TPZStack<long,_10>::TPZStack(&elgraph);
  elgraphindex._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  elgraphindex.fStore = (long *)0x0;
  elgraphindex.fNElements = 0;
  elgraphindex.fNAlloc = 0;
  TPZCompMesh::ComputeElGraph
            ((this->
             super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
             ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fMesh,&elgraph,
             &elgraphindex);
  iVar5 = elgraphindex.fNElements;
  metis.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZRenumbering_016f4b20;
  metis.fNElements = 0;
  metis.fNNodes = 0;
  metis.fNodeWeights._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  metis.fNodeWeights.fStore = (int *)0x0;
  metis.fNodeWeights.fNElements = 0;
  metis.fNodeWeights.fNAlloc = 0;
  metis.fElementGraph._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  metis.fElementGraph.fStore = (long *)0x0;
  metis.fElementGraph.fNElements = 0;
  metis.fElementGraph.fNAlloc = 0;
  metis.fElementGraphIndex._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  metis.fElementGraphIndex.fNAlloc = 0;
  metis.fElementGraphIndex.fStore = (long *)0x0;
  metis.fElementGraphIndex.fNElements = 0;
  metis.fNNodes =
       TPZCompMesh::NIndependentConnects
                 ((this->
                  super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                  ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fMesh);
  metis.fNElements = iVar5 + -1;
  TPZRenumbering::SetElementGraph(&metis,(TPZVec<long> *)&elgraph,&elgraphindex);
  TPZManVector<long,_10>::TPZManVector(&nodegraph,0);
  TPZManVector<long,_10>::TPZManVector(&nodegraphindex,0);
  TPZRenumbering::ConvertGraph
            (&metis,(TPZVec<long> *)&elgraph,&elgraphindex,&nodegraph,&nodegraphindex);
  this_00 = &(this->
             super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
             ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fEquationFilter;
  lVar4 = 1;
  if (1 < nodegraphindex.super_TPZVec<long>.fNElements) {
    lVar4 = nodegraphindex.super_TPZVec<long>.fNElements;
  }
  lVar11 = 0;
  lVar16 = 0;
  lVar17 = 0;
  do {
    this_01 = (this->
              super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
              ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fMesh;
    if (lVar17 == lVar4 + -1) {
      iVar5 = TPZCompMesh::NIndependentConnects(this_01);
      pvVar6 = operator_new__(-(ulong)(lVar11 + 1U >> 0x3d != 0) | lVar11 * 8 + 8U);
      uVar7 = lVar16 / 2;
      uVar18 = 0xffffffffffffffff;
      if (uVar7 < 0x2000000000000000) {
        uVar18 = uVar7 * 8;
      }
      pvVar8 = operator_new__(uVar18);
      __s = operator_new__(-(ulong)(uVar7 >> 0x3c != 0) | uVar7 << 4);
      if (2 < lVar16 + 1U) {
        memset(__s,0,uVar7 << 4);
      }
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      lVar11 = 0;
      uVar18 = 0;
      for (lVar4 = 0; lVar4 != iVar5; lVar4 = lVar4 + 1) {
        iVar15 = (int)lVar4;
        pTVar3 = (((this->
                   super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                   ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fMesh)->
                 fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
        lVar16 = (long)pTVar3[iVar15].dim;
        lVar17 = (long)pTVar3[iVar15].pos;
        iVar9 = TPZEquationFilter::NumActive(this_00,lVar17,lVar16 + lVar17);
        if (iVar9 != 0) {
          if (lVar16 < 1) {
            lVar16 = 0;
          }
          for (lVar17 = 0; lVar17 != lVar16; lVar17 = lVar17 + 1) {
            *(long *)((long)pvVar6 + uVar18 * 8) = lVar11;
            if ((uVar18 & 1) == 0) {
              uVar2 = (((this->
                        super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                        ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fMesh)
                      ->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[iVar15].dim;
              uVar7 = (ulong)uVar2;
              if ((int)uVar2 < 1) {
                uVar7 = 0;
              }
              lVar10 = lVar11 * 0x10;
              for (lVar12 = 0; uVar7 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
                *(undefined8 *)((long)pvVar8 + lVar11 * 8) = 0xffffffffffffffff;
                lVar11 = lVar11 + 1;
                puVar1 = (undefined8 *)((long)__s + lVar12 + lVar10);
                *puVar1 = 0;
                puVar1[1] = 0;
              }
              lVar12 = nodegraphindex.super_TPZVec<long>.fStore[lVar4 + 1];
              for (lVar10 = nodegraphindex.super_TPZVec<long>.fStore[lVar4]; lVar10 < lVar12;
                  lVar10 = lVar10 + 1) {
                pTVar3 = (((this->
                           super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                           ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.
                          fMesh)->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
                lVar19 = (long)pTVar3[(int)nodegraph.super_TPZVec<long>.fStore[lVar10]].dim;
                lVar14 = (long)pTVar3[(int)nodegraph.super_TPZVec<long>.fStore[lVar10]].pos;
                iVar9 = TPZEquationFilter::NumActive(this_00,lVar14,lVar14 + lVar19);
                if (iVar9 != 0) {
                  if (lVar19 < 1) {
                    lVar19 = 0;
                  }
                  lVar14 = lVar11 * 0x10;
                  for (lVar13 = 0; lVar19 * 0x10 != lVar13; lVar13 = lVar13 + 0x10) {
                    *(undefined8 *)((long)pvVar8 + lVar11 * 8) = 0xffffffffffffffff;
                    lVar11 = lVar11 + 1;
                    puVar1 = (undefined8 *)((long)__s + lVar13 + lVar14);
                    *puVar1 = 0;
                    puVar1[1] = 0;
                  }
                }
              }
              uVar18 = uVar18 | 1;
            }
            else {
              uVar18 = uVar18 + 1;
            }
          }
        }
      }
      *(long *)((long)pvVar6 + uVar18 * 8) = lVar11;
      (*(this_02->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x50])(this_02,pvVar6,pvVar8,__s);
      TPZManVector<long,_10>::~TPZManVector(&nodegraphindex);
      TPZManVector<long,_10>::~TPZManVector(&nodegraph);
      TPZRenumbering::~TPZRenumbering(&metis);
      TPZVec<long>::~TPZVec(&elgraphindex);
      TPZManVector<long,_10>::~TPZManVector(&elgraph.super_TPZManVector<long,_10>);
      return &this_02->super_TPZMatrix<std::complex<double>_>;
    }
    pTVar3 = (this_01->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
    lVar10 = (long)pTVar3[(int)lVar17].dim;
    lVar12 = (long)pTVar3[(int)lVar17].pos;
    iVar5 = TPZEquationFilter::NumActive(this_00,lVar12,lVar12 + lVar10);
    if (iVar5 != 0) {
      if (iVar5 != lVar10) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZBSpStructMatrix.cpp"
                   ,0x43);
      }
      lVar11 = lVar11 + lVar10;
      lVar14 = nodegraphindex.super_TPZVec<long>.fStore[lVar17 + 1];
      lVar16 = lVar16 + lVar10 * lVar10;
      for (lVar12 = nodegraphindex.super_TPZVec<long>.fStore[lVar17]; lVar12 < lVar14;
          lVar12 = lVar12 + 1) {
        pTVar3 = (((this->
                   super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                   ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fMesh)->
                 fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
        lVar19 = (long)pTVar3[(int)nodegraph.super_TPZVec<long>.fStore[lVar12]].dim;
        lVar13 = (long)pTVar3[(int)nodegraph.super_TPZVec<long>.fStore[lVar12]].pos;
        iVar5 = TPZEquationFilter::NumActive(this_00,lVar13,lVar13 + lVar19);
        lVar19 = lVar19 * lVar10;
        if (iVar5 == 0) {
          lVar19 = 0;
        }
        lVar16 = lVar16 + lVar19;
      }
    }
    lVar17 = lVar17 + 1;
  } while( true );
}

Assistant:

TPZMatrix<TVar> * TPZBSpStructMatrix<TVar,TPar>::Create(){
    //checked
    if(this->fMesh->FatherMesh()) {
		PZError << "TPZSpStructMatrix should not be called with CreateAssemble for a substructure mesh\n";
        DebugStop();
    }
    int64_t neq = this->fEquationFilter.NActiveEquations();
    TPZFYsmpMatrix<TVar> * mat = new TPZFYsmpMatrix<TVar>(neq,neq);
	
    /**Rearange elements order*/
	//    TPZVec<int> elorder(fMesh->NEquations(),0);
	
	
    /**
     *Longhin implementation
	 */
    TPZStack<int64_t> elgraph;
    TPZVec<int64_t> elgraphindex;
	//    int nnodes = 0;
    this->fMesh->ComputeElGraph(elgraph,elgraphindex);
    /**Creates a element graph*/
    TPZRenumbering metis;
    metis.SetElementsNodes(elgraphindex.NElements() -1 ,this->fMesh->NIndependentConnects());
    metis.SetElementGraph(elgraph,elgraphindex);
	
    TPZManVector<int64_t> nodegraph;
    TPZManVector<int64_t> nodegraphindex;
    /**
     *converts an element graph structure into a node graph structure
     *those vectors have size ZERO !!!
     */
    metis.ConvertGraph(elgraph,elgraphindex,nodegraph,nodegraphindex);
    /**vector sizes*/
    int64_t i;
    int64_t nblock = nodegraphindex.NElements()-1;
    int64_t totalvar = 0;
    int64_t totaleq = 0;
    for(i=0;i<nblock;i++){
		int64_t iblsize = this->fMesh->Block().Size(i);
		int64_t iblpos = this->fMesh->Block().Position(i);
        int64_t numactive = this->fEquationFilter.NumActive(iblpos, iblpos+iblsize);
        if (!numactive) {
            continue;
        }
        if (numactive != iblsize) {
            DebugStop();
        }
		totaleq += iblsize;
		int64_t icfirst = nodegraphindex[i];
		int64_t iclast = nodegraphindex[i+1];
		int64_t j;
		//longhin
		totalvar+=iblsize*iblsize;
		for(j=icfirst;j<iclast;j++) {
			int64_t col = nodegraph[j];
			int64_t colsize = this->fMesh->Block().Size(col);
			int64_t colpos = this->fMesh->Block().Position(col);
            int64_t numactive = this->fEquationFilter.NumActive(colpos, colpos+colsize);
            if (!numactive) {
                continue;
            }
			totalvar += iblsize*colsize;
		}
    }
	
    int64_t ieq = 0;
    int64_t pos = 0;
	
    nblock=this->fMesh->NIndependentConnects();
	
    int64_t * Eq = new int64_t[totaleq+1];
    int64_t * EqCol = new int64_t[totalvar/2];
    TVar * EqValue = new TVar[totalvar/2];
    for(i=0;i<nblock;i++){
		int64_t iblsize = this->fMesh->Block().Size(i);
		int64_t iblpos = this->fMesh->Block().Position(i);
        int64_t numactive = this->fEquationFilter.NumActive(iblpos, iblpos+iblsize);
        if (!numactive) {
            continue;
        }
		int64_t ibleq;
		for(ibleq=0; ibleq<iblsize; ibleq++) {
			Eq[ieq] = pos;
			if(ieq%2) {
				ieq++;
				continue;
			}
			int64_t colsize = this->fMesh->Block().Size(i);
			int64_t colpos = this->fMesh->Block().Position(i);
			int64_t jbleq;
			for(jbleq=0; jbleq<colsize; jbleq++) {
				/**It can also be implemented using half the size of both columns and data vectors*/
				EqCol[pos] = -1;//colpos;
				EqValue[pos] = 0.;
				colpos++;
				pos++;
			}
			
			int64_t icfirst = nodegraphindex[i];
			int64_t iclast = nodegraphindex[i+1];
			int64_t j;
			for(j=icfirst;j<iclast;j++) {
				int64_t col = nodegraph[j];
				colsize = this->fMesh->Block().Size(col);
				colpos = this->fMesh->Block().Position(col);
                int64_t numactive = this->fEquationFilter.NumActive(colpos, colpos+colsize);
                if (!numactive) {
                    continue;
                }
                for(jbleq=0; jbleq<colsize; jbleq++) {
					EqCol[pos] = -1;//colpos;
					EqValue[pos] = 0.;
					colpos++;
					pos++;
				}
			}
			ieq++;
		}
    }
    Eq[ieq] = pos;
	/*    for(i=0;i<totalvar;i++){
	 if(i<totaleq+1){
	 cout << i <<  " " << Eq[i] << " "<< EqCol[i] << " " << EqValue[i] << endl;
	 }else{
	 cout << i <<  " " << " "<< EqCol[i] << " " << EqValue[i] << endl;
	 }
	 }
	 */
    mat->SetData(Eq,EqCol,EqValue);
    return mat;
}